

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nuklear.h
# Opt level: O0

void nk_menubar_end(nk_context *ctx)

{
  nk_window *pnVar1;
  nk_panel *pnVar2;
  nk_command_buffer *out;
  nk_panel *layout;
  nk_window *win;
  nk_context *ctx_local;
  
  if (ctx == (nk_context *)0x0) {
    __assert_fail("ctx",
                  "/workspace/llm4binary/github/license_c_cmakelists/Konf[P]LearnOpenGL-CLion/glfw/deps/nuklear.h"
                  ,0x4ad4,"void nk_menubar_end(struct nk_context *)");
  }
  if (ctx->current == (nk_window *)0x0) {
    __assert_fail("ctx->current",
                  "/workspace/llm4binary/github/license_c_cmakelists/Konf[P]LearnOpenGL-CLion/glfw/deps/nuklear.h"
                  ,0x4ad5,"void nk_menubar_end(struct nk_context *)");
  }
  if (ctx->current->layout == (nk_panel *)0x0) {
    __assert_fail("ctx->current->layout",
                  "/workspace/llm4binary/github/license_c_cmakelists/Konf[P]LearnOpenGL-CLion/glfw/deps/nuklear.h"
                  ,0x4ad6,"void nk_menubar_end(struct nk_context *)");
  }
  if (((ctx != (nk_context *)0x0) && (ctx->current != (nk_window *)0x0)) &&
     (ctx->current->layout != (nk_panel *)0x0)) {
    pnVar1 = ctx->current;
    pnVar2 = pnVar1->layout;
    if (((pnVar2->flags & 0x2000) == 0) && ((pnVar2->flags & 0x8000) == 0)) {
      (pnVar2->menu).h = pnVar2->at_y - (pnVar2->menu).y;
      (pnVar2->bounds).y =
           (pnVar2->bounds).y +
           (pnVar2->menu).h + (ctx->style).window.spacing.y + (pnVar2->row).height;
      (pnVar2->bounds).h =
           (pnVar2->bounds).h -
           ((pnVar2->menu).h + (ctx->style).window.spacing.y + (pnVar2->row).height);
      *pnVar2->offset_x = (pnVar2->menu).offset.x;
      *pnVar2->offset_y = (pnVar2->menu).offset.y;
      pnVar2->at_y = (pnVar2->bounds).y - (pnVar2->row).height;
      (pnVar2->clip).y = (pnVar2->bounds).y;
      (pnVar2->clip).h = (pnVar2->bounds).h;
      nk_push_scissor(&pnVar1->buffer,pnVar2->clip);
    }
  }
  return;
}

Assistant:

NK_API void
nk_menubar_end(struct nk_context *ctx)
{
    struct nk_window *win;
    struct nk_panel *layout;
    struct nk_command_buffer *out;

    NK_ASSERT(ctx);
    NK_ASSERT(ctx->current);
    NK_ASSERT(ctx->current->layout);
    if (!ctx || !ctx->current || !ctx->current->layout)
        return;

    win = ctx->current;
    out = &win->buffer;
    layout = win->layout;
    if (layout->flags & NK_WINDOW_HIDDEN || layout->flags & NK_WINDOW_MINIMIZED)
        return;

    layout->menu.h = layout->at_y - layout->menu.y;
    layout->bounds.y += layout->menu.h + ctx->style.window.spacing.y + layout->row.height;
    layout->bounds.h -= layout->menu.h + ctx->style.window.spacing.y + layout->row.height;

    *layout->offset_x = layout->menu.offset.x;
    *layout->offset_y = layout->menu.offset.y;
    layout->at_y = layout->bounds.y - layout->row.height;

    layout->clip.y = layout->bounds.y;
    layout->clip.h = layout->bounds.h;
    nk_push_scissor(out, layout->clip);
}